

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameracollection.cc
# Opt level: O2

void __thiscall gvr::CameraCollection::loadPLY(CameraCollection *this,PLYReader *ply)

{
  IOException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_38,"Cannot load camera collection from PLY.",&local_39);
  gutil::IOException::IOException(this_00,&local_38);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void CameraCollection::loadPLY(PLYReader &ply)
{
  throw gutil::IOException("Cannot load camera collection from PLY.");
}